

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpull.c
# Opt level: O0

int nn_xpull_add(nn_sockbase *self,nn_pipe *pipe)

{
  void *data_00;
  nn_pipe *in_RSI;
  nn_fq_data *in_RDI;
  size_t sz;
  int rcvprio;
  nn_xpull_data *data;
  nn_xpull *xpull;
  undefined4 in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  undefined7 in_stack_ffffffffffffffc0;
  undefined1 in_stack_ffffffffffffffc7;
  undefined1 uVar1;
  nn_fq *self_00;
  int local_24;
  
  if (in_RDI == (nn_fq_data *)0x0) {
    in_RDI = (nn_fq_data *)0x0;
  }
  self_00 = (nn_fq *)0x4;
  nn_pipe_getopt((nn_pipe *)0x4,(int)((ulong)in_RDI >> 0x20),(int)in_RDI,
                 (void *)CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0),
                 (size_t *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  if (self_00 != (nn_fq *)0x4) {
    nn_backtrace_print();
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","sz == sizeof (rcvprio)",
            "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/vendor/nanomsg/src/protocols/pipeline/xpull.c"
            ,0x6b);
    fflush(_stderr);
    nn_err_abort();
  }
  uVar1 = 0 < local_24 && local_24 < 0x11;
  if (0 >= local_24 || local_24 >= 0x11) {
    nn_backtrace_print();
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","rcvprio >= 1 && rcvprio <= 16",
            "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/vendor/nanomsg/src/protocols/pipeline/xpull.c"
            ,0x6c);
    fflush(_stderr);
    nn_err_abort();
  }
  data_00 = nn_alloc_(0x2f4617);
  if (data_00 == (void *)0x0) {
    nn_backtrace_print();
    fprintf(_stderr,"Out of memory (%s:%d)\n",
            "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/vendor/nanomsg/src/protocols/pipeline/xpull.c"
            ,0x6f);
    fflush(_stderr);
    nn_err_abort();
  }
  nn_pipe_setdata(in_RSI,data_00);
  nn_fq_add(self_00,in_RDI,(nn_pipe *)CONCAT17(uVar1,in_stack_ffffffffffffffc0),
            in_stack_ffffffffffffffbc);
  return 0;
}

Assistant:

static int nn_xpull_add (struct nn_sockbase *self, struct nn_pipe *pipe)
{
    struct nn_xpull *xpull;
    struct nn_xpull_data *data;
    int rcvprio;
    size_t sz;

    xpull = nn_cont (self, struct nn_xpull, sockbase);

    sz = sizeof (rcvprio);
    nn_pipe_getopt (pipe, NN_SOL_SOCKET, NN_RCVPRIO, &rcvprio, &sz);
    nn_assert (sz == sizeof (rcvprio));
    nn_assert (rcvprio >= 1 && rcvprio <= 16);

    data = nn_alloc (sizeof (struct nn_xpull_data), "pipe data (pull)");
    alloc_assert (data);
    nn_pipe_setdata (pipe, data);
    nn_fq_add (&xpull->fq, &data->fq, pipe, rcvprio);

    return 0;
}